

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

void remove_range_closed_at(art_t *art,uint8_t *high48,uint16_t min,uint16_t max)

{
  uint uVar1;
  uint uVar2;
  int32_t iVar3;
  int iVar4;
  art_val_t *__ptr;
  undefined4 extraout_var;
  array_container_t *run;
  ushort uVar5;
  long lVar6;
  uint uVar7;
  rle16_t *prVar8;
  array_container_t *array;
  int iVar9;
  ulong uVar10;
  uint8_t typecode2;
  rle16_t *local_58;
  long local_50;
  ulong local_48;
  art_t *local_40;
  uint8_t *local_38;
  
  __ptr = art_find(art,high48);
  if (__ptr == (art_val_t *)0x0) {
    return;
  }
  run = *(array_container_t **)(__ptr[1].key + 2);
  uVar2 = (uint)min;
  uVar1 = (uint)max;
  local_40 = art;
  local_38 = high48;
  if (__ptr[1].key[0] == '\x03') {
    lVar6 = (long)run->cardinality;
    if ((lVar6 != 0) &&
       ((prVar8 = (rle16_t *)run->array, prVar8->value < min ||
        (max < (ushort)(prVar8[lVar6 + -1].length + prVar8[lVar6 + -1].value))))) {
      local_50 = lVar6;
      iVar3 = rle16_find_run(prVar8,run->cardinality,min);
      local_48 = CONCAT44(extraout_var,iVar3);
      local_58 = prVar8;
      uVar2 = rle16_find_run(prVar8,(int32_t)local_50,max);
      uVar7 = (uint)local_48;
      if ((int)uVar7 < 0) {
        uVar7 = ~uVar7;
LAB_00109c28:
        if ((int)uVar2 < 0) {
          uVar2 = -uVar2 - 2;
        }
        else {
          uVar5 = local_58[uVar2].length + local_58[uVar2].value;
          if (max < uVar5) {
            local_58[uVar2].value = max + 1;
            local_58[uVar2].length = uVar5 - (max + 1);
            uVar2 = uVar2 - 1;
          }
        }
        if ((int)uVar7 <= (int)uVar2) {
          uVar2 = ~uVar2;
          iVar3 = (int32_t)local_50;
          iVar4 = iVar3 + uVar2;
          iVar9 = uVar7 + uVar2;
          prVar8 = local_58;
          if ((iVar9 != 0 && SCARRY4(uVar7,uVar2) == iVar9 < 0) && (run->capacity < iVar9 + iVar4))
          {
            run_container_grow((run_container_t *)run,iVar9 + iVar4,true);
            iVar3 = run->cardinality;
            prVar8 = (rle16_t *)run->array;
          }
          memmove(prVar8 + ((iVar3 - iVar4) + iVar9),prVar8 + (iVar3 - iVar4),(long)iVar4 << 2);
          run->cardinality = run->cardinality + iVar9;
        }
      }
      else {
        uVar10 = local_48 & 0xffffffff;
        uVar5 = local_58[uVar10].value;
        if (min <= uVar5) goto LAB_00109c28;
        if ((uint)local_58[uVar10].length + (uint)uVar5 <= uVar1) {
          local_58[uVar10].length = min + ~uVar5;
          uVar7 = uVar7 + 1;
          goto LAB_00109c28;
        }
        makeRoomAtIndex((run_container_t *)run,(short)local_48 + 1);
        prVar8 = (rle16_t *)run->array;
        prVar8[uVar10 + 1].value = max + 1;
        uVar5 = prVar8[uVar10].value;
        prVar8[uVar10 + 1].length = ~max + uVar5 + prVar8[uVar10].length;
        prVar8[uVar10].length = min + ~uVar5;
      }
      run = (array_container_t *)
            convert_run_to_efficient_container((run_container_t *)run,&typecode2);
      goto LAB_00109cc9;
    }
  }
  else if (__ptr[1].key[0] == '\x02') {
    uVar1 = count_greater((uint16_t *)run->array,run->cardinality,max);
    uVar2 = count_less((uint16_t *)run->array,run->cardinality - uVar1,min);
    if (uVar2 + uVar1 != 0) {
      typecode2 = '\x02';
      iVar9 = run->cardinality - (uVar2 + uVar1);
      if (iVar9 != 0) {
        memmove(&((rle16_t *)run->array)->value + uVar2,
                &((rle16_t *)run->array)->value + (uVar2 + iVar9),(ulong)uVar1 * 2);
        run->cardinality = run->cardinality - iVar9;
      }
      goto LAB_00109cc9;
    }
  }
  else {
    iVar9 = run->cardinality;
    prVar8 = (rle16_t *)run->array;
    iVar4 = bitset_lenrange_cardinality((uint64_t *)prVar8,uVar2,uVar1 - uVar2);
    iVar9 = iVar9 - iVar4;
    if (iVar9 != 0) {
      if (iVar9 < 0x1001) {
        typecode2 = '\x02';
        bitset_reset_range((uint64_t *)prVar8,uVar2,uVar1 + 1);
        run->cardinality = iVar9;
        run = array_container_from_bitset((bitset_container_t *)run);
      }
      else {
        typecode2 = '\x01';
        bitset_reset_range((uint64_t *)prVar8,uVar2,uVar1 + 1);
        run->cardinality = iVar9;
      }
      goto LAB_00109cc9;
    }
  }
  run = (array_container_t *)0x0;
LAB_00109cc9:
  if (run != *(array_container_t **)(__ptr[1].key + 2)) {
    container_free(*(array_container_t **)(__ptr[1].key + 2),__ptr[1].key[0]);
    if (run == (array_container_t *)0x0) {
      art_erase(local_40,local_38);
      roaring_free(__ptr);
    }
    else {
      *(array_container_t **)(__ptr[1].key + 2) = run;
      __ptr[1].key[0] = typecode2;
    }
  }
  return;
}

Assistant:

static inline void remove_range_closed_at(art_t *art, uint8_t *high48,
                                          uint16_t min, uint16_t max) {
    leaf_t *leaf = (leaf_t *)art_find(art, high48);
    if (leaf == NULL) {
        return;
    }
    uint8_t typecode2;
    container_t *container2 = container_remove_range(
        leaf->container, leaf->typecode, min, max, &typecode2);
    if (container2 != leaf->container) {
        container_free(leaf->container, leaf->typecode);
        if (container2 != NULL) {
            leaf->container = container2;
            leaf->typecode = typecode2;
        } else {
            art_erase(art, high48);
            free_leaf(leaf);
        }
    }
}